

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__polygon_offset
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  byte bVar1;
  bool bVar2;
  ParserTemplateBase *this_00;
  long *in_RSI;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLSL__technique__pass__states__polygon_offset__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  ParserChar *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  _Map_pointer additionalText;
  ParserChar *attributeHash;
  ParserChar *text;
  undefined8 *puVar3;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::profile_GLSL__technique__pass__states__polygon_offset__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
  puVar3 = (undefined8 *)*in_RSI;
  if (puVar3 == (undefined8 *)0x0) {
LAB_009e6784:
    if ((((ulong)(this_00->super_Parser)._vptr_Parser & 1) == 0) &&
       (bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2FloatList
                          (in_RDI,in_stack_ffffffffffffff98,(XSList<float> *)0x9e67ad),
       ((bVar2 ^ 0xffU) & 1) == 0)) {
      *(uint *)&(this_00->super_Parser)._vptr_Parser =
           *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          text = (ParserChar *)*puVar3;
          if (text == (ParserChar *)0x0) goto LAB_009e6784;
          in_stack_ffffffffffffff98 =
               (ParserChar *)GeneratedSaxParser::Utils::calculateStringHash(text);
          if (puVar3 + 1 == (undefined8 *)0x0) {
            return false;
          }
          additionalText = (_Map_pointer)puVar3[1];
          puVar3 = puVar3 + 2;
          if (in_stack_ffffffffffffff98 != "") break;
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map = additionalText;
        }
        if (in_stack_ffffffffffffff98 != (ParserChar *)0x7c83b5) break;
        attributeHash = in_stack_ffffffffffffff98;
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2FloatList(in_RDI,(ParserChar *)0x7c83b5,(XSList<float> *)0x9e66e9);
        bVar1 = (bVar2 ^ 0xffU) & 1;
        if ((bVar1 != 0) &&
           (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                               (StringHash)text,(StringHash)attributeHash,
                               (ParserChar *)additionalText), bVar2)) {
          return false;
        }
        if ((bVar1 & 1) == 0) {
          *(uint *)&(this_00->super_Parser)._vptr_Parser =
               *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
        }
      }
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__polygon_offset( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__polygon_offset( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__polygon_offset__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__polygon_offset__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_POLYGON_OFFSET, HASH_ATTRIBUTE_VALUE);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_POLYGON_OFFSET,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float2_type(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_POLYGON_OFFSET,
            HASH_ATTRIBUTE_VALUE,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_POLYGON_OFFSET,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_POLYGON_OFFSET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}


    return true;
}